

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O1

void __thiscall
nodecpp::platform::internal_msg::InternalMsg::append(InternalMsg *this,void *buff_,size_t sz)

{
  bool bVar1;
  ulong uVar2;
  int line;
  uint8_t *__dest;
  ulong __n;
  ulong uVar3;
  
  do {
    if (sz == 0) {
      return;
    }
    if ((this->currentPage).ptr == (uint8_t *)0x0) {
      if (this->totalSz == 0) {
        reserveSpaceForConvertionToTag(this);
      }
      else {
        implAddPage(this);
      }
      if ((this->currentPage).ptr == (uint8_t *)0x0) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                   ,0x1f2,"currentPage.page() != nullptr",true);
      }
    }
    uVar3 = (ulong)((uint)this->totalSz & 0xfff);
    __n = 0x1000 - uVar3;
    __dest = (this->currentPage).ptr + uVar3;
    uVar3 = sz - __n;
    if (sz < __n || uVar3 == 0) {
      memcpy(__dest,buff_,sz);
      uVar2 = this->totalSz + sz;
      this->totalSz = uVar2;
      uVar3 = sz;
      if (sz == __n) {
        line = 0x1fb;
        goto joined_r0x00107ad2;
      }
    }
    else {
      memcpy(__dest,buff_,__n);
      buff_ = (void *)((long)buff_ + __n);
      uVar2 = this->totalSz + __n;
      this->totalSz = uVar2;
      line = 0x206;
joined_r0x00107ad2:
      if ((uVar2 & 0xfff) != 0) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                   ,line,"offsetInCurrentPage() == 0",true);
      }
      (this->currentPage).ptr = (uint8_t *)0x0;
    }
    bVar1 = sz <= __n;
    sz = uVar3;
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void append( const void* buff_, size_t sz )
		{
			const uint8_t* buff = reinterpret_cast<const uint8_t*>(buff_);
			while( sz != 0 )
			{
				if ( currentPage.page() == nullptr )
				{
					if ( totalSz )
						implAddPage();
					else
					{
						NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() == nullptr );
						reserveSpaceForConvertionToTag();
					}
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() != nullptr );
				}
				size_t remainingInPage = remainingSizeInCurrentPage();
				if ( sz <= remainingInPage )
				{
					memcpy( currentPage.page() + offsetInCurrentPage(), buff, sz );
					totalSz += sz;
					if( sz == remainingInPage )
					{
						NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
						currentPage.init();
					}
					break;
				}
				else
				{
					memcpy( currentPage.page() + offsetInCurrentPage(), buff, remainingInPage );
					sz -= remainingInPage;
					buff += remainingInPage;
					totalSz += remainingInPage;
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
					currentPage.init();
				}
			}
		}